

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::mergeResources
          (QPDFObjectHandle *this,QPDFObjectHandle *other,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          *conflicts)

{
  _Rb_tree_node_base *key;
  long lVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  size_type sVar12;
  _Rb_tree_header *this_00;
  QPDFObjectHandle other_val;
  QPDFObjectHandle rval;
  QPDFObjectHandle this_val;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rnames;
  QPDFObjGen rval_og;
  int min_suffix;
  map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  og_to_name;
  mapped_type new_key;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_160;
  undefined1 local_150 [16];
  string *local_140;
  _Base_ptr local_138;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_130;
  undefined1 local_120 [8];
  undefined1 local_118 [16];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_108;
  size_t local_f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *local_f0;
  key_type local_e8;
  int local_dc;
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  iterator local_60;
  
  local_140 = (string *)this;
  local_f0 = conflicts;
  bVar3 = isDictionary(this);
  if (bVar3) {
    bVar3 = isDictionary(other);
    if (bVar3) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)other);
      iVar5 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&local_70);
      local_a8 = (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&local_70);
      while (iVar5._M_node != local_a8) {
        local_a0 = iVar5._M_node;
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_170,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(iVar5._M_node + 2));
        local_138 = iVar5._M_node + 1;
        bVar3 = hasKey((QPDFObjectHandle *)local_140,(string *)(iVar5._M_node + 1));
        if (bVar3) {
          getKey((QPDFObjectHandle *)local_150,local_140);
          bVar3 = isDictionary((QPDFObjectHandle *)local_150);
          if (bVar3) {
            bVar3 = isDictionary((QPDFObjectHandle *)&local_170);
            if (!bVar3) goto LAB_00199eeb;
            if (((element_type *)local_150._0_8_ != (element_type *)0x0) &&
               (((QPDFObjGen *)(local_150._0_8_ + 0x50))->obj != 0)) {
              shallowCopy((QPDFObjectHandle *)local_120);
              replaceKeyAndGetNew((QPDFObjectHandle *)&local_d8,local_140,
                                  (QPDFObjectHandle *)local_138);
              std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_150,
                         (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_d8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_d8._M_impl.super__Rb_tree_header);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_118);
            }
            local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_d8._M_impl.super__Rb_tree_header._M_header;
            local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_118._0_4_ = _S_red;
            local_118._8_8_ = (_Base_ptr)0x0;
            local_108._M_ptr = (element_type *)local_118;
            local_f8 = 0;
            local_dc = 1;
            local_108._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_ptr;
            local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_130,&local_170);
            iVar5 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&local_130);
            local_98 = (_Base_ptr)
                       ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&local_130);
            bVar3 = false;
            for (; iVar5._M_node != local_98;
                iVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar5._M_node)) {
              key = iVar5._M_node + 1;
              std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_160,
                         (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(iVar5._M_node + 2)
                        );
              bVar4 = hasKey((QPDFObjectHandle *)local_150,(string *)key);
              if (bVar4) {
                if (local_f0 !=
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     *)0x0) {
                  if (!bVar3) {
                    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_60,
                               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_150);
                    iVar6 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&local_60);
                    iVar7 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&local_60);
                    for (; iVar6._M_node != iVar7._M_node;
                        iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node)) {
                      bVar3 = ::qpdf::BaseHandle::null((BaseHandle *)(iVar6._M_node + 2));
                      if (((!bVar3) && (lVar1 = *(long *)(iVar6._M_node + 2), lVar1 != 0)) &&
                         (pcVar2 = *(pointer *)(lVar1 + 0x50), (int)pcVar2 != 0)) {
                        local_90._M_dataplus._M_p = pcVar2;
                        std::
                        map<QPDFObjGen,std::__cxx11::string,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,std::__cxx11::string>>>
                        ::insert_or_assign<std::__cxx11::string_const&>
                                  ((map<QPDFObjGen,std::__cxx11::string,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,std::__cxx11::string>>>
                                    *)&local_d8,(key_type *)&local_90,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(iVar6._M_node + 1));
                      }
                    }
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60.m);
                    getResourceNames_abi_cxx11_
                              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_60,(QPDFObjectHandle *)local_150);
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_120,
                                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_60);
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_60);
                  }
                  if (local_160._M_ptr == (element_type *)0x0) {
                    local_e8.obj = 0;
                    local_e8.gen = 0;
LAB_00199e1f:
                    std::operator+(&local_90,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)key,"_");
                    getUniqueResourceName
                              ((string *)&local_60,(QPDFObjectHandle *)local_140,&local_90,&local_dc
                               ,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_120);
                    std::__cxx11::string::~string((string *)&local_90);
                    pmVar10 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                              ::operator[](local_f0,(key_type *)local_138);
                    pmVar11 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[](pmVar10,(key_type *)key);
                    std::__cxx11::string::_M_assign((string *)pmVar11);
                    replaceKey((QPDFObjectHandle *)local_150,(string *)&local_60,
                               (QPDFObjectHandle *)&local_160);
                  }
                  else {
                    local_e8 = (local_160._M_ptr)->og;
                    if (local_e8.obj == 0) goto LAB_00199e1f;
                    sVar8 = std::
                            map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::count((map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_d8,&local_e8);
                    if (sVar8 == 0) goto LAB_00199e1f;
                    pmVar9 = std::
                             map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[]((map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&local_d8,&local_e8);
                    std::__cxx11::string::string((string *)&local_60,(string *)pmVar9);
                    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&local_60,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)key);
                    if (bVar3) {
                      pmVar10 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                ::operator[](local_f0,(key_type *)local_138);
                      pmVar11 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator[](pmVar10,(key_type *)key);
                      std::__cxx11::string::_M_assign((string *)pmVar11);
                    }
                  }
                  std::__cxx11::string::~string((string *)&local_60);
                  bVar3 = true;
                }
              }
              else {
                if ((local_160._M_ptr == (element_type *)0x0) || (((local_160._M_ptr)->og).obj == 0)
                   ) {
                  shallowCopy((QPDFObjectHandle *)&local_60);
                  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                            (&local_160,
                             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60.m);
                }
                replaceKey((QPDFObjectHandle *)local_150,(string *)key,
                           (QPDFObjectHandle *)&local_160);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_160._M_refcount);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount)
            ;
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_120);
            std::
            _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&local_d8);
          }
          else {
LAB_00199eeb:
            bVar3 = isArray((QPDFObjectHandle *)local_150);
            if (bVar3) {
              bVar3 = isArray((QPDFObjectHandle *)&local_170);
              if (bVar3) {
                local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_d8._M_impl.super__Rb_tree_header._M_header;
                local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
                std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_130,
                           (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_150);
                QPDFArrayItems::begin((iterator *)local_120,(QPDFArrayItems *)&local_130);
                QPDFArrayItems::end(&local_60,(QPDFArrayItems *)&local_130);
                while (*(int *)(CONCAT44(local_118._4_4_,local_118._0_4_) + 8) !=
                       (local_60.m.
                        super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->item_number) {
                  QPDFArrayItems::iterator::updateIValue((iterator *)local_120);
                  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                            (&local_160,&local_108);
                  bVar3 = isScalar((QPDFObjectHandle *)&local_160);
                  if (bVar3) {
                    unparse_abi_cxx11_(&local_90,(QPDFObjectHandle *)&local_160);
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_d8,&local_90);
                    std::__cxx11::string::~string((string *)&local_90);
                  }
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_160._M_refcount);
                  QPDFArrayItems::iterator::operator++((iterator *)local_120);
                }
                QPDFArrayItems::iterator::~iterator(&local_60);
                QPDFArrayItems::iterator::~iterator((iterator *)local_120);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_130._M_refcount);
                std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_130,&local_170);
                QPDFArrayItems::begin((iterator *)local_120,(QPDFArrayItems *)&local_130);
                QPDFArrayItems::end(&local_60,(QPDFArrayItems *)&local_130);
                while (*(int *)(CONCAT44(local_118._4_4_,local_118._0_4_) + 8) !=
                       (local_60.m.
                        super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->item_number) {
                  QPDFArrayItems::iterator::updateIValue((iterator *)local_120);
                  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                            (&local_160,&local_108);
                  bVar3 = isScalar((QPDFObjectHandle *)&local_160);
                  if (bVar3) {
                    unparse_abi_cxx11_(&local_90,(QPDFObjectHandle *)&local_160);
                    sVar12 = std::
                             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_d8,&local_90);
                    std::__cxx11::string::~string((string *)&local_90);
                    if (sVar12 == 0) {
                      appendItem((QPDFObjectHandle *)local_150,(QPDFObjectHandle *)&local_160);
                    }
                  }
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_160._M_refcount);
                  QPDFArrayItems::iterator::operator++((iterator *)local_120);
                }
                QPDFArrayItems::iterator::~iterator(&local_60);
                QPDFArrayItems::iterator::~iterator((iterator *)local_120);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_130._M_refcount);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_d8);
              }
            }
          }
          this_00 = (_Rb_tree_header *)(local_150 + 8);
        }
        else {
          shallowCopy((QPDFObjectHandle *)&local_d8);
          replaceKey((QPDFObjectHandle *)local_140,(string *)local_138,(QPDFObjectHandle *)&local_d8
                    );
          this_00 = &local_d8._M_impl.super__Rb_tree_header;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
        iVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(local_a0);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    }
  }
  return;
}

Assistant:

void
QPDFObjectHandle::mergeResources(
    QPDFObjectHandle other, std::map<std::string, std::map<std::string, std::string>>* conflicts)
{
    if (!(isDictionary() && other.isDictionary())) {
        QTC::TC("qpdf", "QPDFObjectHandle merge top type mismatch");
        return;
    }

    auto make_og_to_name = [](QPDFObjectHandle& dict,
                              std::map<QPDFObjGen, std::string>& og_to_name) {
        for (auto const& [key, value]: dict.as_dictionary()) {
            if (!value.null() && value.isIndirect()) {
                og_to_name.insert_or_assign(value.getObjGen(), key);
            }
        }
    };

    // This algorithm is described in comments in QPDFObjectHandle.hh
    // above the declaration of mergeResources.
    for (auto const& [rtype, value1]: other.as_dictionary()) {
        auto other_val = value1;
        if (hasKey(rtype)) {
            QPDFObjectHandle this_val = getKey(rtype);
            if (this_val.isDictionary() && other_val.isDictionary()) {
                if (this_val.isIndirect()) {
                    // Do this even if there are no keys. Various places in the code call
                    // mergeResources with resource dictionaries that contain empty subdictionaries
                    // just to get this shallow copy functionality.
                    QTC::TC("qpdf", "QPDFObjectHandle replace with copy");
                    this_val = replaceKeyAndGetNew(rtype, this_val.shallowCopy());
                }
                std::map<QPDFObjGen, std::string> og_to_name;
                std::set<std::string> rnames;
                int min_suffix = 1;
                bool initialized_maps = false;
                for (auto const& [key, value2]: other_val.as_dictionary()) {
                    QPDFObjectHandle rval = value2;
                    if (!this_val.hasKey(key)) {
                        if (!rval.isIndirect()) {
                            QTC::TC("qpdf", "QPDFObjectHandle merge shallow copy");
                            rval = rval.shallowCopy();
                        }
                        this_val.replaceKey(key, rval);
                    } else if (conflicts) {
                        if (!initialized_maps) {
                            make_og_to_name(this_val, og_to_name);
                            rnames = this_val.getResourceNames();
                            initialized_maps = true;
                        }
                        auto rval_og = rval.getObjGen();
                        if (rval.isIndirect() && og_to_name.count(rval_og)) {
                            QTC::TC("qpdf", "QPDFObjectHandle merge reuse");
                            auto new_key = og_to_name[rval_og];
                            if (new_key != key) {
                                (*conflicts)[rtype][key] = new_key;
                            }
                        } else {
                            QTC::TC("qpdf", "QPDFObjectHandle merge generate");
                            std::string new_key =
                                getUniqueResourceName(key + "_", min_suffix, &rnames);
                            (*conflicts)[rtype][key] = new_key;
                            this_val.replaceKey(new_key, rval);
                        }
                    }
                }
            } else if (this_val.isArray() && other_val.isArray()) {
                std::set<std::string> scalars;
                for (auto this_item: this_val.aitems()) {
                    if (this_item.isScalar()) {
                        scalars.insert(this_item.unparse());
                    }
                }
                for (auto other_item: other_val.aitems()) {
                    if (other_item.isScalar()) {
                        if (scalars.count(other_item.unparse()) == 0) {
                            QTC::TC("qpdf", "QPDFObjectHandle merge array");
                            this_val.appendItem(other_item);
                        } else {
                            QTC::TC("qpdf", "QPDFObjectHandle merge array dup");
                        }
                    }
                }
            }
        } else {
            QTC::TC("qpdf", "QPDFObjectHandle merge copy from other");
            replaceKey(rtype, other_val.shallowCopy());
        }
    }
}